

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::MthdRankineClipPlaneEnable::emulate_mthd(MthdRankineClipPlaneEnable *this)

{
  pgraph_state *state;
  _Bool _Var1;
  byte bVar2;
  uint uVar3;
  int i;
  long lVar4;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  _Var1 = pgraph_in_begin_end(state);
  if (_Var1) {
    MthdTest::warn((MthdTest *)this,4);
    return;
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.val & 0x333333;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_clip_plane_enable = uVar3;
  lVar4 = 0;
  pgraph_bundle(state,0x56,0,uVar3,true);
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_c;
  bVar2 = 0x3e;
  do {
    uVar3 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << (bVar2 & 0x3f)) >>
                   0x3e != 0) << ((byte)lVar4 & 0x3f) | ~(uint)(1L << ((byte)lVar4 & 0x3f)) & uVar3;
    lVar4 = lVar4 + 1;
    bVar2 = bVar2 - 4;
  } while (lVar4 != 6);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_c = uVar3;
  pgraph_flush_xf_mode(state);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t err = 0;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				exp.bundle_clip_plane_enable = val & 0x333333;
				pgraph_bundle(&exp, BUNDLE_CLIP_PLANE_ENABLE, 0, exp.bundle_clip_plane_enable, true);
				for (int i = 0; i < 6; i++)
					insrt(exp.xf_mode_c, i, 1, extr(val, i*4, 2) != 0);
				pgraph_flush_xf_mode(&exp);
			}
		}
	}